

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_enc.c
# Opt level: O0

int WebPMemoryWrite(uint8_t *data,size_t data_size,WebPPicture *picture)

{
  long *plVar1;
  ulong uVar2;
  void *__dest;
  long in_RDX;
  size_t in_RSI;
  void *in_RDI;
  uint64_t next_max_size;
  uint8_t *new_mem;
  uint64_t next_size;
  WebPMemoryWriter *w;
  ulong size;
  uint64_t in_stack_ffffffffffffffc8;
  
  plVar1 = *(long **)(in_RDX + 0x68);
  if (plVar1 != (long *)0x0) {
    uVar2 = plVar1[1] + in_RSI;
    if ((ulong)plVar1[2] < uVar2) {
      size = plVar1[2] << 1;
      if ((ulong)(plVar1[2] << 1) < uVar2) {
        size = uVar2;
      }
      if (size < 0x2000) {
        size = 0x2000;
      }
      __dest = WebPSafeMalloc(in_stack_ffffffffffffffc8,size);
      if (__dest == (void *)0x0) {
        return 0;
      }
      if (plVar1[1] != 0) {
        memcpy(__dest,(void *)*plVar1,plVar1[1]);
      }
      WebPSafeFree((void *)0x1871b5);
      *plVar1 = (long)__dest;
      plVar1[2] = size;
    }
    if (in_RSI != 0) {
      memcpy((void *)(*plVar1 + plVar1[1]),in_RDI,in_RSI);
      plVar1[1] = in_RSI + plVar1[1];
    }
  }
  return 1;
}

Assistant:

int WebPMemoryWrite(const uint8_t* data, size_t data_size,
                    const WebPPicture* picture) {
  WebPMemoryWriter* const w = (WebPMemoryWriter*)picture->custom_ptr;
  uint64_t next_size;
  if (w == NULL) {
    return 1;
  }
  next_size = (uint64_t)w->size + data_size;
  if (next_size > w->max_size) {
    uint8_t* new_mem;
    uint64_t next_max_size = 2ULL * w->max_size;
    if (next_max_size < next_size) next_max_size = next_size;
    if (next_max_size < 8192ULL) next_max_size = 8192ULL;
    new_mem = (uint8_t*)WebPSafeMalloc(next_max_size, 1);
    if (new_mem == NULL) {
      return 0;
    }
    if (w->size > 0) {
      memcpy(new_mem, w->mem, w->size);
    }
    WebPSafeFree(w->mem);
    w->mem = new_mem;
    // down-cast is ok, thanks to WebPSafeMalloc
    w->max_size = (size_t)next_max_size;
  }
  if (data_size > 0) {
    memcpy(w->mem + w->size, data, data_size);
    w->size += data_size;
  }
  return 1;
}